

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

void calc_ranges_all_cols<InputData<float,long>,WorkerMemory<ImputedData<long,double>,double,float>>
               (InputData<float,_long> *input_data,
               WorkerMemory<ImputedData<long,_double>,_double,_float> *workspace,
               ModelParams *model_params,double *ranges,double *saved_xmin,double *saved_xmax)

{
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  ColumnSampler<double>::prepare_full_pass(&workspace->col_sampler);
  sVar2 = (workspace->col_sampler).curr_pos;
  sVar1 = (workspace->col_sampler).curr_col;
  if (sVar2 != 0 && sVar2 != sVar1) {
    do {
      (workspace->col_sampler).last_given = sVar1;
      (workspace->col_sampler).curr_col = sVar1 + 1;
      workspace->col_chosen =
           (workspace->col_sampler).col_indices.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[sVar1];
      get_split_range<InputData<float,long>,WorkerMemory<ImputedData<long,double>,double,float>>
                (workspace,input_data,model_params);
      if (workspace->unsplittable == true) {
        ColumnSampler<double>::drop_col
                  (&workspace->col_sampler,workspace->col_chosen,0xffffffffffffffff);
        sVar2 = workspace->col_chosen;
        ranges[sVar2] = 0.0;
        dVar3 = 0.0;
        dVar4 = 0.0;
      }
      else {
        dVar3 = workspace->xmin;
        dVar4 = workspace->xmax;
        sVar2 = workspace->col_chosen;
        ranges[sVar2] = dVar4 - dVar3;
        if (workspace->tree_kurtoses == (double *)0x0) {
          if (input_data->col_weights == (float *)0x0) goto LAB_002b5483;
          dVar5 = (double)input_data->col_weights[sVar2];
        }
        else {
          dVar5 = workspace->tree_kurtoses[sVar2];
        }
        dVar5 = (dVar4 - dVar3) * dVar5;
        if (dVar5 <= 1e-100) {
          dVar5 = 1e-100;
        }
        ranges[sVar2] = dVar5;
      }
LAB_002b5483:
      if (saved_xmin != (double *)0x0) {
        saved_xmin[sVar2] = dVar3;
        saved_xmax[sVar2] = dVar4;
      }
      sVar2 = (workspace->col_sampler).curr_pos;
    } while ((sVar2 != 0) && (sVar1 = (workspace->col_sampler).curr_col, sVar2 != sVar1));
  }
  return;
}

Assistant:

void calc_ranges_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                          double *restrict ranges, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        get_split_range(workspace, input_data, model_params);

        if (workspace.unsplittable) {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            ranges[workspace.col_chosen] = 0;
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = 0;
                saved_xmax[workspace.col_chosen] = 0;
            }
        }
        else {
            ranges[workspace.col_chosen] = workspace.xmax - workspace.xmin;
            if (workspace.tree_kurtoses != NULL) {
                ranges[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            else if (input_data.col_weights != NULL) {
                ranges[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }
    }
}